

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 simd_test_sse4_1::c_imm_v64_shl_n_32<20>(c_v64 a)

{
  return (c_v64)((a.u64 & 0xfff00000fff) << 0x14);
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift left %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] << n;
  t.u32[0] = a.u32[0] << n;
  return t;
}